

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceSurface::~IfcFaceSurface(IfcFaceSurface *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  
  (this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x8947e0;
  *(undefined8 *)&this->field_0x80 = 0x894880;
  *(undefined8 *)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x894808;
  *(undefined8 *)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x894830;
  *(undefined8 *)&(this->super_IfcFace).field_0x48 = 0x894858;
  pcVar2 = (this->SameSense)._M_dataplus._M_p;
  paVar1 = &(this->SameSense).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x894958;
  *(undefined8 *)&this->field_0x80 = 0x8949d0;
  *(undefined8 *)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x894980;
  *(undefined8 *)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x8949a8;
  pvVar3 = *(void **)&(this->super_IfcFace).super_IfcTopologicalRepresentationItem.field_0x30;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&(this->super_IfcFace).field_0x40 - (long)pvVar3);
  }
  operator_delete(this,0x98);
  return;
}

Assistant:

IfcFaceSurface() : Object("IfcFaceSurface") {}